

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  
  if (((*z == '0') && ((byte)(z[1] | 0x20U) == 0x78)) && ((""[(byte)z[2]] & 8) != 0)) {
    pbVar1 = (byte *)(z + 2);
    do {
      pbVar6 = pbVar1;
      bVar4 = *pbVar6;
      pbVar1 = pbVar6 + 1;
    } while (bVar4 == 0x30);
    lVar3 = 0;
    uVar5 = 0;
    while ((""[bVar4] & 8) != 0) {
      uVar5 = uVar5 << 4 | (ulong)(((char)(bVar4 * '\x02') >> 7 & 9U) + bVar4 & 0xf);
      bVar4 = (pbVar6 + 1)[lVar3];
      lVar3 = lVar3 + 1;
    }
    *pOut = uVar5;
    return (int)(0x10 < (int)lVar3 || pbVar6[lVar3] != 0);
  }
  iVar2 = sqlite3Strlen30(z);
  iVar2 = sqlite3Atoi64(z,pOut,iVar2,'\x01');
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
   && sqlite3Isxdigit(z[2])
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    return (z[k]==0 && k-i<=16) ? 0 : 1;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    return sqlite3Atoi64(z, pOut, sqlite3Strlen30(z), SQLITE_UTF8);
  }
}